

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
::Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
          *table,size_t pos,SiPair *row,uint skip)

{
  size_t *psVar1;
  uint uVar2;
  HashBucket *pHVar3;
  size_t sVar4;
  bool bVar5;
  Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *pTVar6;
  uint hash;
  uint uVar7;
  int iVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar9;
  ulong uVar10;
  HashBucket HVar11;
  SiPair *pSVar12;
  long lVar13;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar14;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  size_t sVar15;
  ulong targetSize;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar16;
  Maybe<unsigned_long> MVar17;
  ArrayPtr<const_unsigned_char> s_00;
  ArrayPtr<const_unsigned_char> s_01;
  bool success;
  byte local_ad;
  uint local_ac;
  SiPair *local_a8;
  Impl<0UL,_false> *local_a0;
  Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *local_98;
  uchar *local_90;
  SiPair *local_88;
  size_t local_80;
  size_t local_78;
  Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *local_70;
  size_t local_68;
  byte *local_60;
  Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *local_58;
  Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *local_50;
  size_t *local_48;
  SiPair *local_40;
  undefined1 local_38;
  
  local_78 = pos;
  if (skip != 0) {
    local_88 = (table->rows).builder.ptr;
    lVar13 = (long)(table->rows).builder.pos - (long)local_88 >> 3;
    local_90 = (uchar *)(row->str).content.ptr;
    local_80 = (row->str).content.size_;
    uVar10 = (table->indexes).impl.
             super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
             .value.buckets.size_ * 2;
    local_ac = skip;
    local_a8 = row;
    local_a0 = this;
    local_68 = pos;
    if (uVar10 < ((table->indexes).impl.
                  super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                  .value.erasedCount + lVar13 * -0x5555555555555555) * 3 + 3) {
      targetSize = lVar13 * 0x5555555555555556 + 2;
      if (targetSize < uVar10) {
        targetSize = uVar10;
      }
      HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::rehash
                ((HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)&table->indexes,
                 targetSize);
    }
    s_00.size_ = local_80 - 1;
    s_00.ptr = local_90;
    local_70 = &table->indexes;
    hash = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s_00);
    uVar7 = _::chooseBucket(hash,(uint)(table->indexes).impl.
                                       super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                                       .value.buckets.size_);
    pHVar3 = (table->indexes).impl.
             super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
             .value.buckets.ptr;
    sVar4 = (table->indexes).impl.
            super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
            .value.buckets.size_;
    paVar16 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
    pSVar12 = local_88;
    local_98 = table;
LAB_0014a376:
    paVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pHVar3 + uVar7);
    uVar2 = *(uint *)((long)paVar9 + 4);
    uVar10 = (ulong)uVar2;
    if (uVar2 == 1) {
      if (paVar16 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar16 = paVar9;
      }
    }
    else {
      if (uVar2 == 0) {
        if (paVar16 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          psVar1 = &(local_98->indexes).impl.
                    super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                    .value.erasedCount;
          *psVar1 = *psVar1 - 1;
          paVar9 = paVar16;
        }
        aVar14.value = ((ulong)hash | local_68 << 0x20) + 0x200000000;
        paVar9->value = (unsigned_long)aVar14;
        bVar5 = false;
        goto LAB_0014a411;
      }
      if (*(uint *)paVar9 == hash) {
        uVar10 = (ulong)(uVar2 - 2);
        sVar15 = pSVar12[uVar10].str.content.size_;
        if ((sVar15 == local_80) &&
           (iVar8 = bcmp(pSVar12[uVar10].str.content.ptr,local_90,sVar15 - 1), pSVar12 = local_88,
           iVar8 == 0)) goto LAB_0014a4f7;
      }
    }
    sVar15 = (ulong)uVar7 + 1;
    uVar7 = (uint)sVar15;
    if (sVar15 == sVar4) {
      uVar7 = 0;
    }
    goto LAB_0014a376;
  }
  MVar17 = Impl<1UL,_false>::insert((Impl<1UL,_false> *)this,table,pos,row,0);
  aVar14 = MVar17.ptr.field_1;
  goto LAB_0014a510;
LAB_0014a4f7:
  bVar5 = true;
  aVar14 = extraout_RDX;
LAB_0014a411:
  pTVar6 = local_98;
  this = local_a0;
  pSVar12 = local_a8;
  if (bVar5) {
    *local_a0 = (Impl<0UL,_false>)0x1;
    *(ulong *)(local_a0 + 8) = uVar10;
  }
  else {
    local_60 = &local_ad;
    local_ad = 0;
    local_58 = local_70;
    local_50 = local_98;
    local_48 = &local_78;
    local_40 = local_a8;
    local_38 = 0;
    MVar17 = Impl<1UL,_false>::insert
                       ((Impl<1UL,_false> *)local_a0,local_98,local_78,local_a8,local_ac);
    aVar14 = MVar17.ptr.field_1;
    local_ad = (byte)*(Impl<1UL,_false> *)this ^ 1;
    if (*(Impl<1UL,_false> *)this == (Impl<1UL,_false>)0x1) {
      iVar8 = (int)local_78;
      s_01.size_ = (pSVar12->str).content.size_ - 1;
      s_01.ptr = (uchar *)(pSVar12->str).content.ptr;
      uVar7 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s_01);
      uVar7 = _::chooseBucket(uVar7,(uint)(pTVar6->indexes).impl.
                                          super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                                          .value.buckets.size_);
      pHVar3 = (pTVar6->indexes).impl.
               super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
               .value.buckets.ptr;
      uVar10 = (ulong)uVar7;
      uVar7 = pHVar3[uVar10].value;
      aVar14 = extraout_RDX_00;
      if (iVar8 + 2U != uVar7) {
        aVar14 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                 (pTVar6->indexes).impl.
                 super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                 .value.buckets.size_;
        do {
          if (uVar7 == 0) {
            _::logHashTableInconsistency();
            aVar14 = extraout_RDX_01;
            goto LAB_0014a510;
          }
          HVar11 = (HashBucket)(uVar10 + 1);
          uVar10 = (ulong)HVar11 & 0xffffffff;
          if (HVar11 == (HashBucket)aVar14.value) {
            uVar10 = 0;
          }
          uVar7 = pHVar3[uVar10].value;
        } while (iVar8 + 2U != uVar7);
      }
      psVar1 = &(pTVar6->indexes).impl.
                super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                .value.erasedCount;
      *psVar1 = *psVar1 + 1;
      pHVar3[uVar10].value = 1;
    }
  }
LAB_0014a510:
  MVar17.ptr.field_1.value = aVar14.value;
  MVar17.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar17.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }